

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector,_void>::visit
          (Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector,_void> *this,Expression *curr)

{
  ulong in_RDX;
  Type type;
  Expression *childp;
  ulong in_R8;
  optional<wasm::HeapType> ht;
  optional<wasm::HeapType> ht_00;
  optional<wasm::HeapType> ct;
  optional<wasm::HeapType> ht_01;
  optional<wasm::HeapType> ht_02;
  optional<wasm::HeapType> ht_03;
  optional<wasm::Type> type_00;
  optional<wasm::HeapType> ht_04;
  optional<wasm::HeapType> ht_05;
  optional<wasm::Type> labelType;
  optional<wasm::Type> labelType_00;
  optional<wasm::HeapType> ct_00;
  optional<wasm::HeapType> ct_01;
  optional<wasm::HeapType> ht_06;
  optional<wasm::HeapType> ht_07;
  optional<wasm::Type> type_01;
  optional<wasm::HeapType> ht_08;
  optional<unsigned_long> arity;
  optional<wasm::HeapType> dest;
  optional<wasm::HeapType> ht_09;
  optional<wasm::HeapType> src;
  optional<wasm::HeapType> src_00;
  optional<wasm::HeapType> dest_00;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBlock
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Block *)curr
                );
      return;
    case IfId:
      IRBuilder::ChildPopper::ConstraintCollector::visitIf((ConstraintCollector *)this,(If *)curr);
      return;
    case LoopId:
      type.id = (curr->type).id;
      childp = curr + 2;
      break;
    case BreakId:
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBreak
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Break *)curr
                 ,labelType_00);
      return;
    case SwitchId:
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSwitch
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Switch *)curr,labelType);
      return;
    case CallId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCall
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Call *)curr)
      ;
      return;
    case CallIndirectId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallIndirect
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (CallIndirect *)curr);
      return;
    case LocalGetId:
    case GlobalGetId:
    case ConstId:
    case MemorySizeId:
    case NopId:
    case UnreachableId:
    case AtomicFenceId:
    case DataDropId:
    case PopId:
    case RefNullId:
    case RefFuncId:
    case TableSizeId:
    case RethrowId:
    case StringConstId:
      return;
    case LocalSetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitLocalSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (LocalSet *)curr);
      return;
    case GlobalSetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitGlobalSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (GlobalSet *)curr);
      return;
    case LoadId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitLoad
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Load *)curr)
      ;
      return;
    case StoreId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStore
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Store *)curr
                );
      return;
    case UnaryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitUnary
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Unary *)curr
                );
      return;
    case BinaryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBinary
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Binary *)curr);
      return;
    case SelectId:
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSelect
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Select *)curr,type_00);
      return;
    case DropId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitDrop
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Drop *)curr,
                 (optional<unsigned_int>)0x0);
      return;
    case ReturnId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitReturn
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Return *)curr);
      return;
    case MemoryGrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryGrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryGrow *)curr);
      return;
    case AtomicRMWId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicRMW
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicRMW *)curr);
      return;
    case AtomicCmpxchgId:
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicCmpxchg
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicCmpxchg *)curr,type_01);
      return;
    case AtomicWaitId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicWait
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicWait *)curr);
      return;
    case AtomicNotifyId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicNotify
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicNotify *)curr);
      return;
    case SIMDExtractId:
      childp = (Expression *)&curr[1].type;
      type.id = 6;
      break;
    case SIMDReplaceId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDReplace
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDReplace *)curr);
      return;
    case SIMDShuffleId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDShuffle
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDShuffle *)curr);
      return;
    case SIMDTernaryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDTernary
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDTernary *)curr);
      return;
    case SIMDShiftId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDShift
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDShift *)curr);
      return;
    case SIMDLoadId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDLoad
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDLoad *)curr);
      return;
    case SIMDLoadStoreLaneId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDLoadStoreLane
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDLoadStoreLane *)curr);
      return;
    case MemoryInitId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryInit
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryInit *)curr);
      return;
    case MemoryCopyId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryCopy
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryCopy *)curr);
      return;
    case MemoryFillId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryFill
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryFill *)curr);
      return;
    case RefIsNullId:
      IRBuilder::ChildPopper::ConstraintCollector::noteAnyReferenceType
                ((ConstraintCollector *)this,(Expression **)(curr + 1));
      return;
    case RefEqId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefEq
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(RefEq *)curr
                );
      return;
    case TableGetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableGet *)curr);
      return;
    case TableSetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableSet *)curr);
      return;
    case TableGrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableGrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableGrow *)curr);
      return;
    case TableFillId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableFill
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableFill *)curr);
      return;
    case TableCopyId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableCopy
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableCopy *)curr);
      return;
    case TableInitId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableInit
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableInit *)curr);
      return;
    case TryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTry
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Try *)curr);
      return;
    case TryTableId:
    case ContNewId:
      type.id = (curr->type).id;
      childp = curr + 1;
      break;
    case ThrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitThrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Throw *)curr
                );
      return;
    case ThrowRefId:
      childp = curr + 1;
      type.id = 0x4a;
      break;
    case TupleMakeId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleMake
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TupleMake *)curr);
      return;
    case TupleExtractId:
      arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = 0;
      arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleExtract
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TupleExtract *)curr,arity);
      return;
    case RefI31Id:
      childp = curr + 1;
      type.id = 2;
      break;
    case I31GetId:
      childp = curr + 1;
      type.id = 0x32;
      break;
    case CallRefId:
      ht_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (CallRef *)curr,ht_07);
      return;
    case RefTestId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefTest
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefTest *)curr);
      return;
    case RefCastId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefCast
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefCast *)curr);
      return;
    case BrOnId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBrOn
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(BrOn *)curr)
      ;
      return;
    case StructNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructNew *)curr);
      return;
    case StructGetId:
      ht_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructGet *)curr,ht_04);
      return;
    case StructSetId:
      ht_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructSet *)curr,ht_09);
      return;
    case StructRMWId:
      ht_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructRMW
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructRMW *)curr,ht_03);
      return;
    case StructCmpxchgId:
      ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructCmpxchg
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructCmpxchg *)curr,ht_00);
      return;
    case ArrayNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNew *)curr);
      return;
    case ArrayNewDataId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewData
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNewData *)curr);
      return;
    case ArrayNewElemId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewElem
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNewElem *)curr);
      return;
    case ArrayNewFixedId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewFixed
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNewFixed *)curr);
      return;
    case ArrayGetId:
      ht_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayGet *)curr,ht_02);
      return;
    case ArraySetId:
      ht_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArraySet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArraySet *)curr,ht_06);
      return;
    case ArrayLenId:
      childp = curr + 1;
      type.id = 0x42;
      break;
    case ArrayCopyId:
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      src_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      src_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_R8;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayCopy
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayCopy *)curr,dest,src_00);
      return;
    case ArrayFillId:
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayFill
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayFill *)curr,ht);
      return;
    case ArrayInitDataId:
      ht_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitData
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayInitData *)curr,ht_01);
      return;
    case ArrayInitElemId:
      ht_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitElem
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayInitElem *)curr,ht_05);
      return;
    case RefAsId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefAs
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(RefAs *)curr
                );
      return;
    case StringNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringNew *)curr);
      return;
    case StringMeasureId:
      childp = (Expression *)&curr[1].type;
      type.id = 0x52;
      break;
    case StringEncodeId:
      ht_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ht_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringEncode
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringEncode *)curr,ht_08);
      return;
    case StringConcatId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringConcat
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringConcat *)curr);
      return;
    case StringEqId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringEq
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringEq *)curr);
      return;
    case StringWTF16GetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringWTF16Get
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringWTF16Get *)curr);
      return;
    case StringSliceWTFId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringSliceWTF
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringSliceWTF *)curr);
      return;
    case ContBindId:
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      dest_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      dest_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_R8;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ContBind *)curr,src,dest_00);
      return;
    case SuspendId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSuspend
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Suspend *)curr);
      return;
    case ResumeId:
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResume
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Resume *)curr,ct_00);
      return;
    case ResumeThrowId:
      ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ResumeThrow *)curr,ct);
      return;
    case StackSwitchId:
      ct_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
      ct_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)in_RDX;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StackSwitch *)curr,ct_01);
      return;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,(Expression **)childp,type);
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visit(Expression *) [SubType = wasm::IRBuilder::ChildPopper::ConstraintCollector, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }